

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O3

void __thiscall bwtil::WaveletTree::WaveletTree(WaveletTree *this,string *text,bool verbose)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  uint uVar10;
  int iVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  size_type sVar13;
  size_type __n;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [64];
  allocator_type local_75;
  int local_74;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *local_70;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_68;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_48;
  undefined1 extraout_var [56];
  
  local_70 = &this->nodes;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  Building Wavelet tree",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  sVar2 = text->_M_string_length;
  this->n = sVar2;
  this->sigma = 0;
  if (sVar2 == 0) {
    uVar10 = 1;
  }
  else {
    pcVar3 = (text->_M_dataplus)._M_p;
    sVar13 = 0;
    uVar5 = 0;
    do {
      bVar1 = pcVar3[sVar13];
      if (uVar5 < bVar1) {
        this->sigma = (uint)bVar1;
        uVar5 = (uint)bVar1;
      }
      sVar13 = sVar13 + 1;
    } while (sVar2 != sVar13);
    uVar10 = uVar5 + 1;
  }
  this->sigma = uVar10;
  auVar19._0_8_ = log2((double)uVar10);
  auVar19._8_56_ = extraout_var;
  auVar4 = vroundsd_avx(auVar19._0_16_,auVar19._0_16_,10);
  uVar5 = vcvttsd2usi_avx512f(auVar4);
  this->log_sigma = uVar5;
  __n = ~(-1L << ((ulong)uVar5 & 0x3f));
  this->number_of_nodes = __n;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   Number of nodes = ",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   filling nodes ... ",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    __n = this->number_of_nodes;
  }
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            (&local_68,__n,&local_75);
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->nodes).
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_48);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_68);
  if (this->n != 0) {
    uVar14 = 0;
    uVar8 = 0;
    iVar16 = -1;
    do {
      iVar15 = (int)uVar8;
      bVar18 = (iVar15 * -0x33333333 + 0x19999998U >> 1 | iVar15 * -0x80000000) < 0x19999999;
      iVar11 = iVar16;
      if (bVar18 && iVar16 < iVar15) {
        iVar11 = iVar15;
      }
      if ((bVar18 && iVar16 < iVar15) && verbose) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   ",3);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"% done.",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        iVar11 = iVar15;
      }
      uVar8 = (ulong)this->log_sigma;
      local_74 = iVar11;
      if (this->log_sigma != 0) {
        iVar16 = -1;
        uVar12 = 0;
        uVar7 = 0;
        do {
          if (text->_M_string_length <= uVar14) {
            uVar9 = std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar14);
            std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::
            ~vector(local_70);
            _Unwind_Resume(uVar9);
          }
          uVar17 = uVar7 & 0xffffffff;
          uVar5 = 1 << ((int)uVar8 + iVar16 & 0x1fU) & (uint)(byte)(text->_M_dataplus)._M_p[uVar14];
          succinct_bitvector::push_back
                    ((local_70->
                     super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar17,uVar5 != 0);
          uVar7 = uVar17 * 2 + 1;
          if (uVar5 != 0) {
            uVar7 = uVar17 * 2 + 2;
          }
          uVar12 = uVar12 + 1;
          iVar16 = iVar16 + -1;
          uVar8 = (ulong)this->log_sigma;
        } while (uVar12 < uVar8);
      }
      uVar8 = uVar14 * 100;
      uVar14 = uVar14 + 1;
      uVar8 = uVar8 / this->n;
      iVar16 = local_74;
    } while (uVar14 < this->n);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   Done.",8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  return;
}

Assistant:

WaveletTree(const string &text, bool verbose=false){

		if (verbose) cout << "  Building Wavelet tree"<<endl;

		this->n = text.length();
		sigma = 0;

		for(ulint i=0;i<n;i++)
			if((uchar)text.at(i)>sigma)
				sigma = (uchar)text.at(i);

		sigma++;

		log_sigma = ceil(log2(sigma));

		number_of_nodes = ((ulint)1<<log_sigma)-1;

		if (verbose) cout << "   Number of nodes = "<< number_of_nodes << endl;

		if (verbose) cout << "   filling nodes ... " << endl;

		nodes = vector<succinct_bitvector>(number_of_nodes);

		uint node = root();

		int perc=0,last_perc=-1;

		for(ulint i=0;i<n;i++){

			if(perc>last_perc and perc%10==0){

				if (verbose) cout << "   " << perc << "% done." <<endl;
				last_perc=perc;

			}

			for(ulint j=0;j<log_sigma;j++){

				bool bit = bitInChar((uchar)text.at(i),j);

				nodes[node].push_back(bit);

				node = (bit?child1(node):child0(node));

			}

			node = root();

			perc = (100*i)/n;

		}

		if (verbose) cout << "   Done." << endl;

	}